

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QVariant * __thiscall
QtPrivate::QCalendarModel::data
          (QVariant *__return_storage_ptr__,QCalendarModel *this,QModelIndex *index,int role)

{
  int column;
  int column_00;
  int iVar1;
  DayOfWeek day;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_68 [16];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (role == 7) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QVariant::QVariant(__return_storage_ptr__,0x84);
      return __return_storage_ptr__;
    }
    goto LAB_003a4c88;
  }
  iVar1 = index->r;
  column = index->c;
  if (role == 0) {
    if (((column == 0) && (this->m_weekNumbersShown != false)) &&
       (iVar1 < this->m_firstRow + 6 && this->m_firstRow <= iVar1)) {
      iVar2 = this->m_firstColumn - this->m_firstDay;
      column_00 = iVar2 + 8;
      if ((int)this->m_firstDay < 2) {
        column_00 = iVar2 + 1;
      }
      local_58.d = (Data *)dateForCell(this,iVar1,column_00);
      if (0x16d3e147973 < (long)local_58.d + 0xb69eeff91fU) goto LAB_003a4b3b;
      iVar1 = QDate::weekNumber((int *)&local_58);
LAB_003a4bb6:
      ::QVariant::QVariant(__return_storage_ptr__,iVar1);
    }
    else {
LAB_003a4b3b:
      if (((iVar1 == 0) && (this->m_horizontalHeaderFormat != NoHorizontalHeader)) &&
         (column < this->m_firstColumn + 7 && this->m_firstColumn <= column)) {
        day = dayOfWeekForColumn(this,column);
        dayName((QString *)&local_58,this,day);
        ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
      }
      else {
        local_68._0_8_ = dateForCell(this,iVar1,column);
        if (local_68._0_8_ + 0xb69eeff91f < 0x16d3e147974) {
          iVar1 = QDate::day(local_68,*(undefined8 *)&this->m_calendar);
          goto LAB_003a4bb6;
        }
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
        ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    goto LAB_003a4c66;
  }
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  formatForCell((QTextCharFormat *)local_68,this,iVar1,column);
  switch(role) {
  case 3:
    QTextCharFormat::toolTip((QString *)&local_58,(QTextCharFormat *)local_68);
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    break;
  default:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    break;
  case 6:
    QTextCharFormat::font();
    QFont::operator_cast_to_QVariant(__return_storage_ptr__,(QFont *)&local_58);
    QFont::~QFont((QFont *)&local_58);
    break;
  case 8:
    QTextFormat::background((QTextFormat *)&local_58);
    goto LAB_003a4c0c;
  case 9:
    QTextFormat::foreground((QTextFormat *)&local_58);
LAB_003a4c0c:
    QColor::operator_cast_to_QVariant
              (__return_storage_ptr__,(QColor *)&((local_58.d)->super_QArrayData).alloc);
    QBrush::~QBrush((QBrush *)&local_58);
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
LAB_003a4c66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003a4c88:
  __stack_chk_fail();
}

Assistant:

QVariant QCalendarModel::data(const QModelIndex &index, int role) const
{
    if (role == Qt::TextAlignmentRole)
        return (int) Qt::AlignCenter;

    int row = index.row();
    int column = index.column();

    if (role == Qt::DisplayRole) {
        if (m_weekNumbersShown && column == HeaderColumn
            && row >= m_firstRow && row < m_firstRow + RowCount) {
            QDate date = dateForCell(row, columnForDayOfWeek(Qt::Monday));
            if (date.isValid())
                return date.weekNumber();
        }
        if (m_horizontalHeaderFormat != QCalendarWidget::NoHorizontalHeader && row == HeaderRow
            && column >= m_firstColumn && column < m_firstColumn + ColumnCount)
            return dayName(dayOfWeekForColumn(column));
        QDate date = dateForCell(row, column);
        if (date.isValid())
            return date.day(m_calendar);
        return QString();
    }

    QTextCharFormat fmt = formatForCell(row, column);
    if (role == Qt::BackgroundRole)
        return fmt.background().color();
    if (role == Qt::ForegroundRole)
        return fmt.foreground().color();
    if (role == Qt::FontRole)
        return fmt.font();
    if (role == Qt::ToolTipRole)
        return fmt.toolTip();
    return QVariant();
}